

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O2

_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
 XPMP2::
 iterRnd<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>>
           (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
            lower,_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
                  upper)

{
  int iVar1;
  difference_type dVar2;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
  _Var3;
  _Base_ptr local_20;
  
  local_20 = lower._M_node;
  dVar2 = std::
          __distance<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>>
                    ();
  _Var3._M_node = upper._M_node;
  if ((0 < dVar2) && (_Var3._M_node = lower._M_node, dVar2 != 1)) {
    iVar1 = rand();
    if (dVar2 <= (long)((float)dVar2 * (float)iVar1 * 4.656613e-10)) {
      _Var3 = std::
              prev<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>>
                        (upper,1);
      return (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
              )_Var3._M_node;
    }
    std::
    __advance<std::_Rb_tree_iterator<std::pair<unsigned_long_const,std::pair<XPMP2::CSLModel*,XPMP2::CSLModel::MatchCritTy_const*>>>,long>
              (&local_20);
    _Var3._M_node = local_20;
  }
  return (_Rb_tree_iterator<std::pair<const_unsigned_long,_std::pair<XPMP2::CSLModel_*,_const_XPMP2::CSLModel::MatchCritTy_*>_>_>
          )_Var3._M_node;
}

Assistant:

IteratorT iterRnd (IteratorT lower, IteratorT upper)
{
    const long dist = (long)std::distance(lower, upper);
    // Does the range (cslUpper excluded!) not contain anything?
    if (dist <= 0)
        return upper;
    // Does the "range" only contain exactly one element? Then shortcut the search
    if (dist == 1)
        return lower;
    // Contains more than one, so make a random choice
    const float rnd = float(std::rand()) / float(RAND_MAX); // should be less than 1.0
    const long adv = long(rnd * dist);                      // therefor, should be less than `dist`
    if (adv < dist)                                         // but let's make sure
        std::advance(lower, long(adv));
    else
        lower = std::prev(upper);
    return lower;
}